

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.c
# Opt level: O0

void mbedtls_ct_memcpy_offset
               (uchar *dest,uchar *src,size_t offset,size_t offset_min,size_t offset_max,size_t len)

{
  mbedtls_ct_condition_t condition;
  mbedtls_ct_uint_t local_40;
  size_t offsetval;
  size_t len_local;
  size_t offset_max_local;
  size_t offset_min_local;
  size_t offset_local;
  uchar *src_local;
  uchar *dest_local;
  
  for (local_40 = offset_min; local_40 <= offset_max; local_40 = local_40 + 1) {
    condition = mbedtls_ct_uint_eq(local_40,offset);
    mbedtls_ct_memcpy_if(condition,dest,src + local_40,(uchar *)0x0,len);
  }
  return;
}

Assistant:

void mbedtls_ct_memcpy_offset(unsigned char *dest,
                              const unsigned char *src,
                              size_t offset,
                              size_t offset_min,
                              size_t offset_max,
                              size_t len)
{
    size_t offsetval;

    for (offsetval = offset_min; offsetval <= offset_max; offsetval++) {
        mbedtls_ct_memcpy_if(mbedtls_ct_uint_eq(offsetval, offset), dest, src + offsetval, NULL,
                             len);
    }
}